

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_1::ConcurrentSSBOAtomicCounterMixedCase::init
          (ConcurrentSSBOAtomicCounterMixedCase *this,EVP_PKEY_CTX *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pcVar3;
  TestLog *pTVar4;
  RenderContext *pRVar5;
  Context *pCVar6;
  int iVar7;
  deUint32 err;
  int extraout_EAX;
  undefined4 extraout_var;
  ShaderProgram *pSVar8;
  TestError *pTVar9;
  string *psVar10;
  long lVar11;
  ScopedLogSection section;
  ostringstream buf;
  deUint32 zeroBuf [2];
  ScopedLogSection local_2f0;
  string local_2e8;
  Context *local_2c8;
  Context local_2b8;
  value_type local_2a0;
  undefined1 local_280 [112];
  ios_base local_210 [264];
  undefined1 local_108 [144];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_78;
  undefined1 local_58 [32];
  undefined8 local_38;
  
  iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar11 = CONCAT44(extraout_var,iVar7);
  local_38 = 0;
  (**(code **)(lVar11 + 0x6c8))(1,&this->m_bufferID);
  (**(code **)(lVar11 + 0x40))(0x90d2,this->m_bufferID);
  (**(code **)(lVar11 + 0x150))(0x90d2,8,&local_38,0x88ea);
  err = (**(code **)(lVar11 + 0x800))();
  glu::checkError(err,"gen buffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                  ,0xbc5);
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_280._0_8_ = local_280 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"SSBOProgram","");
  pcVar2 = local_108 + 0x10;
  local_108._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"SSBO atomic program","");
  psVar10 = (string *)local_108;
  tcu::ScopedLogSection::ScopedLogSection(&local_2f0,pTVar4,(string *)local_280,psVar10);
  if ((pointer)local_108._0_8_ != pcVar2) {
    operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
  }
  if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
    operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
  }
  pSVar8 = (ShaderProgram *)operator_new(0xd0);
  pRVar5 = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(local_108,0,0xac);
  local_58._0_8_ = (pointer)0x0;
  local_58[8] = 0;
  local_58._9_7_ = 0;
  local_58[0x10] = 0;
  local_58._17_8_ = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_280);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_280,"${GLSL_VERSION_DECL}\n",0x15);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_280,
             "layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n",0x42);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_280,"layout (binding = 1, std430) volatile buffer WorkBuffer\n",0x38);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_280,"\thighp uint targetValue;\n",0x19);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_280,"\thighp uint dummy;\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"} sb_work;\n",0xb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"void main ()\n",0xd);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_280,"\t// flip high bits\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_280,
             "\thighp uint mask = uint(1) << (24u + (gl_GlobalInvocationID.x % 8u));\n",0x46);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_280,"\tsb_work.dummy = atomicXor(sb_work.targetValue, mask);\n",0x37);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"}",1);
  pCVar6 = (this->super_TestCase).m_context;
  std::__cxx11::stringbuf::str();
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_2e8,(_anonymous_namespace_ *)pCVar6,local_2c8,(char *)psVar10);
  if (local_2c8 != &local_2b8) {
    operator_delete(local_2c8,(ulong)((long)&(local_2b8.m_testCtx)->m_platform + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_280);
  std::ios_base::~ios_base(local_210);
  local_2b8.m_contextInfo._0_4_ = 5;
  paVar1 = &local_2a0.field_2;
  local_2a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2a0,local_2e8._M_dataplus._M_p,
             local_2e8._M_dataplus._M_p + local_2e8._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_108 + (ulong)(uint)local_2b8.m_contextInfo * 0x18),&local_2a0);
  glu::ShaderProgram::ShaderProgram(pSVar8,pRVar5,(ProgramSources *)local_108);
  this->m_ssboAtomicProgram = pSVar8;
  pcVar3 = local_280 + 0x10;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_58);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_78);
  lVar11 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_108 + lVar11));
    lVar11 = lVar11 + -0x18;
  } while (lVar11 != -0x18);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  this->m_ssboAtomicProgram);
  if ((this->m_ssboAtomicProgram->m_program).m_info.linkOk != false) {
    tcu::TestLog::endSection(local_2f0.m_log);
    pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_280._0_8_ = pcVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"AtomicCounterProgram","");
    local_108._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"Atomic counter program","")
    ;
    psVar10 = (string *)local_108;
    tcu::ScopedLogSection::ScopedLogSection(&local_2f0,pTVar4,(string *)local_280,psVar10);
    if ((pointer)local_108._0_8_ != pcVar2) {
      operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
    }
    if ((pointer)local_280._0_8_ != pcVar3) {
      operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
    }
    pSVar8 = (ShaderProgram *)operator_new(0xd0);
    pRVar5 = ((this->super_TestCase).m_context)->m_renderCtx;
    memset(local_108,0,0xac);
    local_58._0_8_ = (pointer)0x0;
    local_58[8] = 0;
    local_58._9_7_ = 0;
    local_58[0x10] = 0;
    local_58._17_8_ = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_280);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_280,"${GLSL_VERSION_DECL}\n",0x15);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_280,
               "layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n",0x42);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_280,
               "layout (binding = 2, offset = 0) uniform atomic_uint u_counter;\n",0x40);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"void main ()\n",0xd);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"{\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_280,"\tatomicCounterIncrement(u_counter);\n",0x24);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"}",1);
    pCVar6 = (this->super_TestCase).m_context;
    std::__cxx11::stringbuf::str();
    Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_2e8,(_anonymous_namespace_ *)pCVar6,local_2c8,(char *)psVar10);
    if (local_2c8 != &local_2b8) {
      operator_delete(local_2c8,(ulong)((long)&(local_2b8.m_testCtx)->m_platform + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_280);
    std::ios_base::~ios_base(local_210);
    local_2b8.m_contextInfo._0_4_ = 5;
    local_2a0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2a0,local_2e8._M_dataplus._M_p,
               local_2e8._M_dataplus._M_p + local_2e8._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_108 + (ulong)(uint)local_2b8.m_contextInfo * 0x18),&local_2a0);
    glu::ShaderProgram::ShaderProgram(pSVar8,pRVar5,(ProgramSources *)local_108);
    this->m_atomicCounterProgram = pSVar8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
      operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_58);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_78);
    lVar11 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_108 + lVar11));
      lVar11 = lVar11 + -0x18;
    } while (lVar11 != -0x18);
    glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                    this->m_atomicCounterProgram);
    if ((this->m_atomicCounterProgram->m_program).m_info.linkOk != false) {
      tcu::TestLog::endSection(local_2f0.m_log);
      return extraout_EAX;
    }
    pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
    local_280._0_8_ = local_280 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_280,"could not build program","");
    tcu::TestError::TestError(pTVar9,(string *)local_280);
    __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
  local_280._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"could not build program","");
  tcu::TestError::TestError(pTVar9,(string *)local_280);
  __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ConcurrentSSBOAtomicCounterMixedCase::init (void)
{
	const glw::Functions&		gl			= m_context.getRenderContext().getFunctions();
	const deUint32				zeroBuf[2]	= { 0, 0 };

	// gen buffer

	gl.genBuffers(1, &m_bufferID);
	gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, m_bufferID);
	gl.bufferData(GL_SHADER_STORAGE_BUFFER, (int)(sizeof(deUint32) * 2), zeroBuf, GL_DYNAMIC_COPY);

	GLU_EXPECT_NO_ERROR(gl.getError(), "gen buffers");

	// gen programs

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "SSBOProgram", "SSBO atomic program");

		m_ssboAtomicProgram = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(genSSBOComputeSource()));
		m_testCtx.getLog() << *m_ssboAtomicProgram;
		if (!m_ssboAtomicProgram->isOk())
			throw tcu::TestError("could not build program");
	}
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "AtomicCounterProgram", "Atomic counter program");

		m_atomicCounterProgram = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(genAtomicCounterComputeSource()));
		m_testCtx.getLog() << *m_atomicCounterProgram;
		if (!m_atomicCounterProgram->isOk())
			throw tcu::TestError("could not build program");
	}
}